

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O1

void deqp::gles2::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  DrawTestSpec spec;
  DrawTestSpec local_68;
  
  local_68.baseVertex = baseSpec->baseVertex;
  local_68.apiType.m_bits = (baseSpec->apiType).m_bits;
  local_68.primitive = baseSpec->primitive;
  local_68.primitiveCount = baseSpec->primitiveCount;
  local_68.drawMethod = baseSpec->drawMethod;
  local_68.indexType = baseSpec->indexType;
  local_68.indexPointerOffset = baseSpec->indexPointerOffset;
  local_68.indexStorage = baseSpec->indexStorage;
  local_68.first = baseSpec->first;
  local_68.indexMin = baseSpec->indexMin;
  local_68.indexMax = baseSpec->indexMax;
  local_68.instanceCount = baseSpec->instanceCount;
  local_68.indirectOffset = baseSpec->indirectOffset;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::vector(&local_68.attribs,&baseSpec->attribs);
  local_68.primitiveCount = 1;
  deqp::gls::DrawTest::addIteration(test,&local_68,"draw count = 1");
  local_68.primitiveCount = 5;
  deqp::gls::DrawTest::addIteration(test,&local_68,"draw count = 5");
  local_68.primitiveCount = 0x19;
  deqp::gls::DrawTest::addIteration(test,&local_68,"draw count = 25");
  if (local_68.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.attribs.
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else
		DE_ASSERT(false);
}